

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbefec.cpp
# Opt level: O0

int DSDcc::HammingMBE::mbe_hamming1511(uchar *in,uchar *out)

{
  int stmp2;
  int stmp;
  int syndrome;
  int block;
  int errs;
  int j;
  int i;
  uchar *out_local;
  uchar *in_local;
  
  block = 0;
  for (i = 0xe; -1 < i; i = i + -1) {
    block = (uint)in[i] | block << 1;
  }
  syndrome = 0;
  for (i = 0; i < 4; i = i + 1) {
    stmp = *(uint *)(hammingGenerator + (long)i * 4) & block;
    stmp2 = stmp % 2;
    for (j = 0; j < 0xe; j = j + 1) {
      stmp = stmp >> 1;
      stmp2 = stmp % 2 ^ stmp2;
    }
    syndrome = stmp2 | syndrome << 1;
  }
  if (0 < syndrome) {
    block = *(uint *)(hammingMatrix + (long)syndrome * 4) ^ block;
  }
  errs = (int)(0 < syndrome);
  for (i = 0xe; -1 < i; i = i + -1) {
    out[i] = (uchar)((int)(block & 0x4000U) >> 0xe);
    block = block << 1;
  }
  return errs;
}

Assistant:

int HammingMBE::mbe_hamming1511(unsigned char *in, unsigned char *out)
{
    int i, j, errs, block, syndrome, stmp, stmp2;

    errs = 0;
    block = 0;

    for (i = 14; i >= 0; i--)
    {
        block <<= 1;
        block |= in[i];
    }

    syndrome = 0;

    for (i = 0; i < 4; i++)
    {
        syndrome <<= 1;
        stmp = block;
        stmp &= hammingGenerator[i];
        stmp2 = (stmp % 2);

        for (j = 0; j < 14; j++)
        {
            stmp >>= 1;
            stmp2 ^= (stmp % 2);
        }

        syndrome |= stmp2;
    }

    if (syndrome > 0)
    {
        errs++;
        block ^= hammingMatrix[syndrome];
    }

    for (i = 14; i >= 0; i--)
    {
        out[i] = (block & 0x4000) >> 14;
        block = block << 1;
    }

    return errs;
}